

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_debug_impl_glUniform2f(GLint arg0,GLfloat arg1,GLfloat arg2)

{
  GLfloat arg2_local;
  GLfloat arg1_local;
  GLint arg0_local;
  
  (*_pre_call_callback)
            ("glUniform2f",glad_debug_glUniform2f,3,(double)arg1,(double)arg2,(ulong)(uint)arg0);
  (*glad_glUniform2f)(arg0,arg1,arg2);
  (*_post_call_callback)
            ("glUniform2f",glad_debug_glUniform2f,3,(double)arg1,(double)arg2,(ulong)(uint)arg0);
  return;
}

Assistant:

void APIENTRY glad_debug_impl_glUniform2f(GLint arg0, GLfloat arg1, GLfloat arg2) {    
    _pre_call_callback("glUniform2f", (void*)glUniform2f, 3, arg0, arg1, arg2);
     glad_glUniform2f(arg0, arg1, arg2);
    _post_call_callback("glUniform2f", (void*)glUniform2f, 3, arg0, arg1, arg2);
    
}